

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_useRowMatchFinderMode_e useRowMatchFinder,ZSTD_compResetPolicy_e crp,
                 ZSTD_indexResetPolicy_e forceResetIndex,ZSTD_resetTarget_e forWho)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  U32 *pUVar4;
  uint *puVar5;
  ZSTD_match_t *pZVar6;
  ZSTD_optimal_t *pZVar7;
  size_t bytes;
  U16 *pUVar8;
  long local_88;
  uint local_80;
  uint local_7c;
  long local_78;
  bool local_65;
  U32 rowLog;
  size_t tagTableSize;
  size_t h3Size;
  U32 hashLog3;
  size_t hSize;
  size_t chainSize;
  ZSTD_indexResetPolicy_e forceResetIndex_local;
  ZSTD_compResetPolicy_e crp_local;
  ZSTD_useRowMatchFinderMode_e useRowMatchFinder_local;
  ZSTD_compressionParameters *cParams_local;
  ZSTD_cwksp *ws_local;
  ZSTD_matchState_t *ms_local;
  
  local_65 = ms->dedicatedDictSearch != 0 && forWho == ZSTD_resetTarget_CDict;
  iVar2 = ZSTD_allocateChainTable(cParams->strategy,useRowMatchFinder,(uint)local_65);
  if (iVar2 == 0) {
    local_78 = 0;
  }
  else {
    local_78 = 1L << ((byte)cParams->chainLog & 0x3f);
  }
  lVar3 = 1L << ((byte)cParams->hashLog & 0x3f);
  if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->minMatch == 3)) {
    if (cParams->windowLog < 0x12) {
      local_7c = cParams->windowLog;
    }
    else {
      local_7c = 0x11;
    }
    local_80 = local_7c;
  }
  else {
    local_80 = 0;
  }
  if (local_80 == 0) {
    local_88 = 0;
  }
  else {
    local_88 = 1L << ((byte)local_80 & 0x3f);
  }
  if (forceResetIndex == ZSTDirp_reset) {
    ZSTD_window_init(&ms->window);
    ZSTD_cwksp_mark_tables_dirty(ws);
  }
  ms->hashLog3 = local_80;
  ZSTD_invalidateMatchState(ms);
  ZSTD_cwksp_clear_tables(ws);
  pUVar4 = (U32 *)ZSTD_cwksp_reserve_table(ws,lVar3 << 2);
  ms->hashTable = pUVar4;
  pUVar4 = (U32 *)ZSTD_cwksp_reserve_table(ws,local_78 << 2);
  ms->chainTable = pUVar4;
  pUVar4 = (U32 *)ZSTD_cwksp_reserve_table(ws,local_88 << 2);
  ms->hashTable3 = pUVar4;
  iVar2 = ZSTD_cwksp_reserve_failed(ws);
  if (iVar2 == 0) {
    if (crp != ZSTDcrp_leaveDirty) {
      ZSTD_cwksp_clean_tables(ws);
    }
    if ((forWho == ZSTD_resetTarget_CCtx) && (ZSTD_btlazy2 < cParams->strategy)) {
      puVar5 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x400);
      (ms->opt).litFreq = puVar5;
      puVar5 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x90);
      (ms->opt).litLengthFreq = puVar5;
      puVar5 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0xd4);
      (ms->opt).matchLengthFreq = puVar5;
      puVar5 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x80);
      (ms->opt).offCodeFreq = puVar5;
      pZVar6 = (ZSTD_match_t *)ZSTD_cwksp_reserve_aligned(ws,0x8008);
      (ms->opt).matchTable = pZVar6;
      pZVar7 = (ZSTD_optimal_t *)ZSTD_cwksp_reserve_aligned(ws,0x1c01c);
      (ms->opt).priceTable = pZVar7;
    }
    iVar2 = ZSTD_rowMatchFinderUsed(cParams->strategy,useRowMatchFinder);
    if (iVar2 != 0) {
      bytes = lVar3 << 1;
      pUVar8 = (U16 *)ZSTD_cwksp_reserve_aligned(ws,bytes);
      ms->tagTable = pUVar8;
      if (ms->tagTable != (U16 *)0x0) {
        memset(ms->tagTable,0,bytes);
      }
      iVar2 = 5;
      if (cParams->searchLog < 5) {
        iVar2 = 4;
      }
      ms->rowHashLog = cParams->hashLog - iVar2;
    }
    uVar1 = cParams->chainLog;
    (ms->cParams).windowLog = cParams->windowLog;
    (ms->cParams).chainLog = uVar1;
    uVar1 = cParams->searchLog;
    (ms->cParams).hashLog = cParams->hashLog;
    (ms->cParams).searchLog = uVar1;
    uVar1 = cParams->targetLength;
    (ms->cParams).minMatch = cParams->minMatch;
    (ms->cParams).targetLength = uVar1;
    (ms->cParams).strategy = cParams->strategy;
    iVar2 = ZSTD_cwksp_reserve_failed(ws);
    if (iVar2 == 0) {
      ms_local = (ZSTD_matchState_t *)0x0;
    }
    else {
      ms_local = (ZSTD_matchState_t *)0xffffffffffffffc0;
    }
  }
  else {
    ms_local = (ZSTD_matchState_t *)0xffffffffffffffc0;
  }
  return (size_t)ms_local;
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    /* disable chain table allocation for fast or row-based strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder,
                                                     ms->dedicatedDictSearch && (forWho == ZSTD_resetTarget_CDict))
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    assert(useRowMatchFinder != ZSTD_urm_auto);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    }

    if (ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)) {
        {   /* Row match finder needs an additional table of hashes ("tags") */
            size_t const tagTableSize = hSize*sizeof(U16);
            ms->tagTable = (U16*)ZSTD_cwksp_reserve_aligned(ws, tagTableSize);
            if (ms->tagTable) ZSTD_memset(ms->tagTable, 0, tagTableSize);
        }
        {   /* Switch to 32-entry rows if searchLog is 5 (or more) */
            U32 const rowLog = cParams->searchLog < 5 ? 4 : 5;
            assert(cParams->hashLog > rowLog);
            ms->rowHashLog = cParams->hashLog - rowLog;
        }
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");
    return 0;
}